

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

node_map * __thiscall
poplar::
compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::expand(node_map *__return_storage_ptr__,
        compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
        *this)

{
  node_map *pnVar1;
  bool bVar2;
  ulong i_00;
  uint64_t i;
  ulong uVar3;
  ulong node_id;
  pointer ppVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  uint64_t new_node_id;
  unsigned_long local_248;
  node_map *local_240;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  bit_vector done_flags;
  size_p2 low_size;
  compact_vector map_high;
  anon_class_24_3_fa13a3ba set_mapping;
  anon_class_24_3_fa13a3ba get_mapping;
  this_type new_ht;
  
  compact_bonsai_trie(&new_ht,(this->capa_size_).bits_ + 1,(this->symb_size_).bits_,0);
  new_ht.size_ = 1;
  bit_vector::bit_vector(&done_flags,(this->capa_size_).mask_ + 1);
  *done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start =
       *done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start | 1;
  uVar3 = (this->table_).width_;
  low_size.bits_ = (uint32_t)uVar3;
  low_size.mask_ = ~(-1L << (uVar3 & 0x3f));
  map_high.mask_ = 0;
  map_high.width_ = 0;
  map_high.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  map_high.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  map_high.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  map_high.size_ = 0;
  if (low_size.bits_ <= new_ht.capa_size_.bits_ && new_ht.capa_size_.bits_ - low_size.bits_ != 0) {
    compact_vector::compact_vector
              ((compact_vector *)&path,(this->capa_size_).mask_ + 1,
               new_ht.capa_size_.bits_ - low_size.bits_);
    compact_vector::operator=(&map_high,(compact_vector *)&path);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&path);
  }
  path.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  path.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  path.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240 = __return_storage_ptr__;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve(&path,0x100);
  set_mapping.map_high = &map_high;
  set_mapping.low_size = &low_size;
  set_mapping.this = this;
  get_mapping.map_high = set_mapping.map_high;
  get_mapping.this = this;
  get_mapping.low_size = set_mapping.low_size;
  for (uVar3 = 1; pnVar1 = local_240, uVar3 < (this->table_).size_; uVar3 = uVar3 + 1) {
    if (((done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0) &&
       (bVar2 = compare_dsp_(this,uVar3,0), !bVar2)) {
      node_id = uVar3;
      if (path.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          path.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        path.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             path.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      do {
        pVar5 = get_parent_and_symb(this,node_id);
        local_248 = pVar5.second;
        i_00 = pVar5.first;
        new_node_id = node_id;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&path,(pair<unsigned_long,_unsigned_long> *)&new_node_id);
        node_id = i_00;
      } while ((done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start[i_00 >> 6] >> (i_00 & 0x3f) & 1) == 0);
      new_node_id = expand::anon_class_24_3_fa13a3ba::operator()(&get_mapping,i_00);
      for (ppVar4 = path.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppVar4 != path.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar4 = ppVar4 + -1) {
        add_child(&new_ht,&new_node_id,ppVar4[-1].second);
        expand::anon_class_24_3_fa13a3ba::operator()(&set_mapping,ppVar4[-1].first,new_node_id);
        done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start[ppVar4[-1].first >> 6] =
             done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[ppVar4[-1].first >> 6] |
             1L << (ppVar4[-1].first & 0x3f);
      }
    }
  }
  node_map::node_map(local_240,&map_high,&this->table_,&done_flags);
  std::
  swap<poplar::compact_bonsai_trie<95u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>>
            (this,&new_ht);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&path.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&map_high);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&done_flags);
  ~compact_bonsai_trie(&new_ht);
  return pnVar1;
}

Assistant:

node_map expand() {
        // this_type new_ht{capa_bits() + 1, symb_size_.bits(), aux_cht_.capa_bits()};
        this_type new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        size_p2 low_size{table_.width()};
        compact_vector map_high;

        if (low_size.bits() < new_ht.capa_bits()) {
            map_high = compact_vector(capa_size(), new_ht.capa_bits() - low_size.bits());
        }

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        auto get_mapping = [&](uint64_t i) -> uint64_t {
            if (map_high.size() == 0) {
                return table_[i];
            } else {
                return table_[i] | (map_high[i] << low_size.bits());
            }
        };

        auto set_mapping = [&](uint64_t i, uint64_t v) {
            if (map_high.size() == 0) {
                table_.set(i, v);
            } else {
                table_.set(i, v & low_size.mask());
                map_high.set(i, v >> low_size.bits());
            }
        };

        // 0 is root
        for (uint64_t i = 1; i < table_.size(); ++i) {
            if (done_flags[i] or compare_dsp_(i, 0)) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = get_mapping(node_id);

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                set_mapping(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(map_high), std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }